

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O2

void __thiscall
myvk::FrameManager::CmdPipelineSetScreenSize
          (FrameManager *this,Ptr<myvk::CommandBuffer> *command_buffer)

{
  VkExtent2D VVar1;
  CommandBuffer *pCVar2;
  initializer_list<VkRect2D> __l;
  initializer_list<VkViewport> __l_00;
  allocator_type local_51;
  _Vector_base<VkViewport,_std::allocator<VkViewport>_> local_50;
  VkViewport local_38;
  
  VVar1 = (((this->m_swapchain).super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_swapchain_create_info).imageExtent;
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.width = (float)VVar1.width;
  local_38.height = (float)VVar1.height;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)&local_50,__l,&local_51);
  CommandBuffer::CmdSetScissor(pCVar2,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)&local_50);
  std::_Vector_base<VkRect2D,_std::allocator<VkRect2D>_>::~_Vector_base
            ((_Vector_base<VkRect2D,_std::allocator<VkRect2D>_> *)&local_50);
  local_38.width = (float)((ulong)VVar1 & 0xffffffff);
  local_38.height = (float)((ulong)VVar1 >> 0x20);
  pCVar2 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.minDepth = 0.0;
  local_38.maxDepth = 1.0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_38;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)&local_50,__l_00,
             (allocator_type *)&local_51);
  CommandBuffer::CmdSetViewport(pCVar2,(vector<VkViewport,_std::allocator<VkViewport>_> *)&local_50)
  ;
  std::_Vector_base<VkViewport,_std::allocator<VkViewport>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void FrameManager::CmdPipelineSetScreenSize(const Ptr<myvk::CommandBuffer> &command_buffer) const {
	VkExtent2D extent = m_swapchain->GetExtent();
	VkRect2D scissor = {};
	scissor.extent = extent;
	command_buffer->CmdSetScissor({scissor});
	VkViewport viewport = {};
	viewport.width = (float)extent.width;
	viewport.height = (float)extent.height;
	viewport.maxDepth = 1.0f;
	command_buffer->CmdSetViewport({viewport});
}